

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

GenericResponseSentHandler * __thiscall
anon_unknown.dwarf_1c6ef40::Impl::EventHandlers::responseSent
          (GenericResponseSentHandler *__return_storage_ptr__,EventHandlers *this,TypeInfo *typeinfo
          )

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false>
  local_50 [3];
  _Node_iterator_base<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false>
  local_38;
  iterator it;
  unique_lock<std::mutex> lock;
  TypeInfo *typeinfo_local;
  EventHandlers *this_local;
  
  lock._8_8_ = typeinfo;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&it,&this->responseSentMutex)
  ;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_dap::Error_*)>,_std::hash<const_dap::TypeInfo_*>,_std::equal_to<const_dap::TypeInfo_*>,_std::allocator<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>_>_>
       ::find(&this->responseSentMap,(key_type *)&lock._M_owns);
  local_50[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_dap::Error_*)>,_std::hash<const_dap::TypeInfo_*>,_std::equal_to<const_dap::TypeInfo_*>,_std::allocator<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>_>_>
       ::end(&this->responseSentMap);
  bVar1 = std::__detail::operator!=(&local_38,local_50);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false,_false>
                           *)&local_38);
    std::function<void_(const_void_*,_const_dap::Error_*)>::function
              (__return_storage_ptr__,&ppVar2->second);
  }
  else {
    std::function<void_(const_void_*,_const_dap::Error_*)>::function(__return_storage_ptr__);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&it);
  return __return_storage_ptr__;
}

Assistant:

GenericResponseSentHandler responseSent(const dap::TypeInfo* typeinfo) {
      std::unique_lock<std::mutex> lock(responseSentMutex);
      auto it = responseSentMap.find(typeinfo);
      return (it != responseSentMap.end()) ? it->second
                                           : decltype(it->second){};
    }